

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O3

bool __thiscall dtc::input_buffer::consume_binary<unsigned_int>(input_buffer *this,uint *out)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = this->cursor;
  iVar3 = 4 - iVar4 % 4;
  if (iVar4 % 4 == 0) {
    iVar3 = 0;
  }
  if (this->size < iVar3 + iVar4 + 4) {
    bVar2 = false;
  }
  else {
    this->cursor = iVar3 + iVar4;
    if ((iVar3 + iVar4 & 3U) != 0) {
      __assert_fail("cursor % type_size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/input_buffer.hh"
                    ,0xf4,"bool dtc::input_buffer::consume_binary(T &) [T = unsigned int]");
    }
    *out = 0;
    pcVar1 = this->buffer;
    uVar5 = 0;
    iVar4 = 4;
    do {
      bVar2 = this->cursor <= this->size;
      if (this->size < this->cursor) {
        return bVar2;
      }
      *out = uVar5 << 8;
      iVar3 = this->cursor;
      this->cursor = iVar3 + 1;
      uVar5 = (uint)(byte)pcVar1[iVar3] | *out;
      *out = uVar5;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return bVar2;
}

Assistant:

bool consume_binary(T &out)
	{
		int align = 0;
		int type_size = sizeof(T);
		if (cursor % type_size != 0)
		{
			align = type_size - (cursor % type_size);
		}
		if (size < cursor + align + type_size)
		{
			return false;
		}
		cursor += align;
		assert(cursor % type_size == 0);
		out = 0;
		for (int i=0 ; i<type_size ; ++i)
		{
			if (size < cursor)
			{
				return false;
			}
			out <<= 8;
			out |= (((T)buffer[cursor++]) & 0xff);
		}
		return true;
	}